

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

void negate_twos_complement(uint8_t *buf,size_t len)

{
  uint8_t uVar1;
  ulong uStack_28;
  uint8_t t;
  size_t i;
  uint8_t borrow;
  size_t len_local;
  uint8_t *buf_local;
  
  i._7_1_ = 0;
  for (uStack_28 = len - 1; uStack_28 < len; uStack_28 = uStack_28 - 1) {
    uVar1 = buf[uStack_28];
    buf[uStack_28] = -uVar1 - i._7_1_;
    i._7_1_ = i._7_1_ | uVar1 != '\0';
  }
  return;
}

Assistant:

static void negate_twos_complement(uint8_t *buf, size_t len) {
  uint8_t borrow = 0;
  for (size_t i = len - 1; i < len; i--) {
    uint8_t t = buf[i];
    buf[i] = 0u - borrow - t;
    borrow |= t != 0;
  }
}